

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O1

void __thiscall trackerboy::Module::clear(Module *this)

{
  (this->mVersion).major = 0;
  (this->mVersion).minor = 0;
  *(undefined8 *)&(this->mVersion).patch = 0x100000000;
  this->mRevisionMinor = 1;
  InfoStr::clear(&this->mTitle);
  InfoStr::clear(&this->mArtist);
  InfoStr::clear(&this->mCopyright);
  SongList::clear(&this->mSongs);
  (this->mComments)._M_string_length = 0;
  *(this->mComments)._M_dataplus._M_p = '\0';
  Table<trackerboy::Instrument>::clear(&this->mInstrumentTable);
  Table<trackerboy::Waveform>::clear(&this->mWaveformTable);
  this->mSystem = dmg;
  this->mCustomFramerate = 0x1e;
  return;
}

Assistant:

void Module::clear() noexcept {
    mVersion = {0, 0, 0};
    mRevisionMajor = FILE_REVISION_MAJOR;
    mRevisionMinor = FILE_REVISION_MINOR;
    mTitle.clear();
    mArtist.clear();
    mCopyright.clear();
    mSongs.clear();
    mComments.clear();
    mInstrumentTable.clear();
    mWaveformTable.clear();
    mSystem = System::dmg;
    mCustomFramerate = 30;
}